

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<void_(const_std::error_code_&,_unsigned_long)>::
callable_impl<void,_cppcms::impl::cgi::scgi::ignore_io>::callable_impl
          (callable_impl<void,_cppcms::impl::cgi::scgi::ignore_io> *this,ignore_io *f)

{
  callable<void_()> *pcVar1;
  
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__refcounted_00287bd8;
  booster::atomic_counter::atomic_counter(&(this->super_callable_type).super_refcounted.refs_,0);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__callable_impl_0028dc78;
  pcVar1 = (f->h).call_ptr.p_;
  (this->func).h.call_ptr.p_ = pcVar1;
  if (pcVar1 != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  return;
}

Assistant:

callable_impl(F f) : func(f){}